

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

TPZVec<long_double_*> * __thiscall
TPZVec<long_double_*>::operator=(TPZVec<long_double_*> *this,initializer_list<long_double_*> *list)

{
  size_type sVar1;
  const_iterator pplVar2;
  initializer_list<long_double_*> *in_RSI;
  TPZVec<long_double_*> *in_RDI;
  longdouble **aux;
  const_iterator it_end;
  const_iterator it;
  longdouble **local_28;
  const_iterator local_18;
  
  sVar1 = std::initializer_list<long_double_*>::size(in_RSI);
  (*in_RDI->_vptr_TPZVec[3])(in_RDI,sVar1);
  local_18 = std::initializer_list<long_double_*>::begin(in_RSI);
  pplVar2 = std::initializer_list<long_double_*>::end((initializer_list<long_double_*> *)in_RDI);
  local_28 = in_RDI->fStore;
  for (; local_18 != pplVar2; local_18 = local_18 + 1) {
    *local_28 = *local_18;
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}